

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microui.c
# Opt level: O2

void mu_end_window(mu_Context *ctx)

{
  mu_Container *pmVar1;
  mu_Command *pmVar2;
  mu_Command *in_RSI;
  
  mu_pop_clip_rect(ctx);
  pmVar1 = mu_get_current_container(ctx);
  pmVar2 = push_jump(ctx,in_RSI);
  pmVar1->tail = pmVar2;
  (pmVar1->head->jump).dst = (ctx->command_list).items + (ctx->command_list).idx;
  mu_pop_clip_rect(ctx);
  pop_container(ctx);
  return;
}

Assistant:

void mu_end_window(mu_Context *ctx) {
  mu_pop_clip_rect(ctx);
  end_root_container(ctx);
}